

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapUICommand.cxx
# Opt level: O2

bool cmQTWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pbVar1;
  __single_object _Var2;
  undefined8 uVar3;
  bool bVar4;
  ulong uVar5;
  string *psVar6;
  string *psVar7;
  string *psVar8;
  cmSourceFile *this_00;
  string *psVar9;
  string *sourceName;
  string *psVar10;
  string *name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  string_view value;
  string_view value_00;
  __single_object cc;
  string uiName;
  undefined1 local_2f8 [24];
  char *pcStack_2e0;
  size_type local_2d8;
  pointer local_2d0;
  size_type local_2c8;
  pointer local_2c0;
  size_type local_2b8;
  pointer local_2b0;
  size_type local_2a8;
  pointer local_2a0;
  string hName;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_268;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_260;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_258;
  string sourceListValue;
  string headerListValue;
  string mocName;
  string cxxName;
  string srcName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines mocCommandLines;
  cmCustomCommandLines cxxCommandLines;
  cmCustomCommandLines hCommandLines;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < 0x61) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f8,"called with incorrect number of arguments",
               (allocator<char> *)&uiName);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar10 = (string *)local_2f8;
  }
  else {
    this = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f8,"QT_UIC_EXECUTABLE",(allocator<char> *)&uiName);
    psVar6 = cmMakefile::GetRequiredDefinition(this,(string *)local_2f8);
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f8,"QT_MOC_EXECUTABLE",(allocator<char> *)&uiName);
    psVar7 = cmMakefile::GetRequiredDefinition(this,(string *)local_2f8);
    std::__cxx11::string::~string((string *)local_2f8);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar10 = pbVar1 + 1;
    name = pbVar1 + 2;
    psVar8 = cmMakefile::GetSafeDefinition(this,psVar10);
    std::__cxx11::string::string((string *)&headerListValue,(string *)psVar8);
    psVar8 = cmMakefile::GetSafeDefinition(this,name);
    std::__cxx11::string::string((string *)&sourceListValue,(string *)psVar8);
    psVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (sourceName = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 3; sourceName != psVar8;
        sourceName = sourceName + 1) {
      this_00 = cmMakefile::GetSource(this,sourceName,Ambiguous);
      if (this_00 == (cmSourceFile *)0x0) {
LAB_001f9808:
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&srcName,sourceName);
        psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        local_2f8._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_2f8._0_8_ = psVar9->_M_string_length;
        uiName._M_dataplus._M_p = (pointer)0x1;
        uiName._M_string_length = (size_type)&uiName.field_2;
        uiName.field_2._M_local_buf[0] = '/';
        cmStrCat<std::__cxx11::string,char[3]>
                  (&hName,(cmAlphaNum *)local_2f8,(cmAlphaNum *)&uiName,&srcName,
                   (char (*) [3])0x59c07f);
        psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        local_2f8._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_2f8._0_8_ = psVar9->_M_string_length;
        uiName._M_dataplus._M_p = (pointer)0x1;
        uiName._M_string_length = (size_type)&uiName.field_2;
        uiName.field_2._M_local_buf[0] = '/';
        cmStrCat<std::__cxx11::string,char[5]>
                  (&cxxName,(cmAlphaNum *)local_2f8,(cmAlphaNum *)&uiName,&srcName,
                   (char (*) [5])0x5a4499);
        psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        local_2f8._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_2f8._0_8_ = psVar9->_M_string_length;
        uiName._M_dataplus._M_p = (pointer)0x5;
        uiName._M_string_length = (size_type)anon_var_dwarf_619590;
        cmStrCat<std::__cxx11::string,char[5]>
                  (&mocName,(cmAlphaNum *)local_2f8,(cmAlphaNum *)&uiName,&srcName,
                   (char (*) [5])0x5a4499);
        uiName._M_dataplus._M_p = (pointer)&uiName.field_2;
        uiName._M_string_length = 0;
        uiName.field_2._M_local_buf[0] = '\0';
        bVar4 = cmsys::SystemTools::FileIsFullPath(sourceName);
        if (bVar4) {
          std::__cxx11::string::_M_assign((string *)&uiName);
        }
        else {
          if (this_00 == (cmSourceFile *)0x0) {
LAB_001f9962:
            cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          }
          else {
            bVar4 = cmSourceFile::GetIsGenerated(this_00,GlobalAndLocal);
            if (!bVar4) goto LAB_001f9962;
            cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
          }
          std::__cxx11::string::_M_assign((string *)&uiName);
          std::__cxx11::string::append((char *)&uiName);
          std::__cxx11::string::append((string *)&uiName);
        }
        if (headerListValue._M_string_length != 0) {
          std::__cxx11::string::append((char *)&headerListValue);
        }
        std::__cxx11::string::append((string *)&headerListValue);
        if (sourceListValue._M_string_length != 0) {
          std::__cxx11::string::append((char *)&sourceListValue);
        }
        std::__cxx11::string::append((string *)&sourceListValue);
        std::__cxx11::string::append((char *)&sourceListValue);
        std::__cxx11::string::append((string *)&sourceListValue);
        local_2f8._8_8_ = (psVar6->_M_dataplus)._M_p;
        local_2f8._0_8_ = psVar6->_M_string_length;
        local_2f8._16_8_ = 2;
        pcStack_2e0 = "-o";
        local_2d8 = hName._M_string_length;
        local_2d0 = hName._M_dataplus._M_p;
        local_2c8 = uiName._M_string_length;
        local_2c0 = uiName._M_dataplus._M_p;
        ilist._M_len = 4;
        ilist._M_array = (iterator)local_2f8;
        cmMakeSingleCommandLine(&hCommandLines,ilist);
        local_2f8._8_8_ = (psVar6->_M_dataplus)._M_p;
        local_2f8._0_8_ = psVar6->_M_string_length;
        local_2f8._16_8_ = 5;
        pcStack_2e0 = "-impl";
        local_2d8 = hName._M_string_length;
        local_2d0 = hName._M_dataplus._M_p;
        local_2c8 = 2;
        local_2c0 = "-o";
        local_2b8 = cxxName._M_string_length;
        local_2b0 = cxxName._M_dataplus._M_p;
        local_2a8 = uiName._M_string_length;
        local_2a0 = uiName._M_dataplus._M_p;
        ilist_00._M_len = 6;
        ilist_00._M_array = (iterator)local_2f8;
        cmMakeSingleCommandLine(&cxxCommandLines,ilist_00);
        local_2f8._8_8_ = (psVar7->_M_dataplus)._M_p;
        local_2f8._0_8_ = psVar7->_M_string_length;
        local_2f8._16_8_ = 2;
        pcStack_2e0 = "-o";
        local_2d8 = mocName._M_string_length;
        local_2d0 = mocName._M_dataplus._M_p;
        local_2c8 = hName._M_string_length;
        local_2c0 = hName._M_dataplus._M_p;
        ilist_01._M_len = 4;
        ilist_01._M_array = (iterator)local_2f8;
        cmMakeSingleCommandLine(&mocCommandLines,ilist_01);
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&uiName);
        std::make_unique<cmCustomCommand>();
        _Var2 = cc;
        std::__cxx11::string::string((string *)&local_50,(string *)&hName);
        cmCustomCommand::SetOutputs
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        _Var2 = cc;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_a8,&depends);
        cmCustomCommand::SetDepends
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
        _Var2 = cc;
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                  (&local_c0,
                   &hCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        cmCustomCommand::SetCommandLines
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                   (cmCustomCommandLines *)&local_c0);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_c0);
        local_258._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
        ._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)cc;
        cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
        local_2f8._16_8_ = 0;
        pcStack_2e0 = (char *)0x0;
        local_2f8._0_8_ = (pointer)0x0;
        local_2f8._8_8_ = (char *)0x0;
        cmMakefile::AddCustomCommandToOutput
                  (this,&local_258,(CommandSourceCallback *)local_2f8,false);
        std::_Function_base::~_Function_base((_Function_base *)local_2f8);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_258);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&hName);
        std::make_unique<cmCustomCommand>();
        uVar3 = local_2f8._0_8_;
        local_2f8._0_8_ = (pointer)0x0;
        std::__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::reset
                  ((__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&cc,
                   (pointer)uVar3);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_2f8);
        _Var2 = cc;
        std::__cxx11::string::string((string *)&local_70,(string *)&cxxName);
        cmCustomCommand::SetOutputs
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        _Var2 = cc;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_d8,&depends);
        cmCustomCommand::SetDepends
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_d8);
        _Var2 = cc;
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                  (&local_f0,
                   &cxxCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        cmCustomCommand::SetCommandLines
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                   (cmCustomCommandLines *)&local_f0);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_f0);
        local_260._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
        ._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)cc;
        cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
        local_2f8._16_8_ = 0;
        pcStack_2e0 = (char *)0x0;
        local_2f8._0_8_ = (pointer)0x0;
        local_2f8._8_8_ = (char *)0x0;
        cmMakefile::AddCustomCommandToOutput
                  (this,&local_260,(CommandSourceCallback *)local_2f8,false);
        std::_Function_base::~_Function_base((_Function_base *)local_2f8);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_260);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&depends);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&hName);
        std::make_unique<cmCustomCommand>();
        uVar3 = local_2f8._0_8_;
        local_2f8._0_8_ = (pointer)0x0;
        std::__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::reset
                  ((__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&cc,
                   (pointer)uVar3);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_2f8);
        _Var2 = cc;
        std::__cxx11::string::string((string *)&local_90,(string *)&mocName);
        cmCustomCommand::SetOutputs
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        _Var2 = cc;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_108,&depends);
        cmCustomCommand::SetDepends
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_108);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108);
        _Var2 = cc;
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                  (&local_120,
                   &mocCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        cmCustomCommand::SetCommandLines
                  ((cmCustomCommand *)
                   _Var2._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                   (cmCustomCommandLines *)&local_120);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_120);
        local_268._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
        ._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)cc;
        cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
        local_2f8._16_8_ = 0;
        pcStack_2e0 = (char *)0x0;
        local_2f8._0_8_ = (pointer)0x0;
        local_2f8._8_8_ = (char *)0x0;
        cmMakefile::AddCustomCommandToOutput
                  (this,&local_268,(CommandSourceCallback *)local_2f8,false);
        std::_Function_base::~_Function_base((_Function_base *)local_2f8);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_268);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&depends);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                  (&mocCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                  (&cxxCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                  (&hCommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        std::__cxx11::string::~string((string *)&uiName);
        std::__cxx11::string::~string((string *)&mocName);
        std::__cxx11::string::~string((string *)&cxxName);
        std::__cxx11::string::~string((string *)&hName);
        std::__cxx11::string::~string((string *)&srcName);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2f8,"WRAP_EXCLUDE",(allocator<char> *)&uiName);
        bVar4 = cmSourceFile::GetPropertyAsBool(this_00,(string *)local_2f8);
        std::__cxx11::string::~string((string *)local_2f8);
        if (!bVar4) goto LAB_001f9808;
      }
    }
    value._M_str = sourceListValue._M_dataplus._M_p;
    value._M_len = sourceListValue._M_string_length;
    cmMakefile::AddDefinition(this,name,value);
    value_00._M_str = headerListValue._M_dataplus._M_p;
    value_00._M_len = headerListValue._M_string_length;
    cmMakefile::AddDefinition(this,psVar10,value_00);
    std::__cxx11::string::~string((string *)&sourceListValue);
    psVar10 = &headerListValue;
  }
  std::__cxx11::string::~string((string *)psVar10);
  return 0x60 < uVar5;
}

Assistant:

bool cmQTWrapUICommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the uic and moc executables to run in the custom commands.
  std::string const& uic_exe = mf.GetRequiredDefinition("QT_UIC_EXECUTABLE");
  std::string const& moc_exe = mf.GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& headerList = args[1];
  std::string const& sourceList = args[2];
  std::string headerListValue = mf.GetSafeDefinition(headerList);
  std::string sourceListValue = mf.GetSafeDefinition(sourceList);

  // Create rules for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(3)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the files to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string hName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), '/', srcName, ".h");
      std::string cxxName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), '/', srcName, ".cxx");
      std::string mocName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), "/moc_", srcName, ".cxx");

      // Compute the name of the ui file from which to generate others.
      std::string uiName;
      if (cmSystemTools::FileIsFullPath(arg)) {
        uiName = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          uiName = mf.GetCurrentBinaryDirectory();
        } else {
          uiName = mf.GetCurrentSourceDirectory();
        }
        uiName += "/";
        uiName += arg;
      }

      // create the list of headers
      if (!headerListValue.empty()) {
        headerListValue += ";";
      }
      headerListValue += hName;

      // create the list of sources
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += cxxName;
      sourceListValue += ";";
      sourceListValue += mocName;

      // set up .ui to .h and .cxx command
      cmCustomCommandLines hCommandLines =
        cmMakeSingleCommandLine({ uic_exe, "-o", hName, uiName });
      cmCustomCommandLines cxxCommandLines = cmMakeSingleCommandLine(
        { uic_exe, "-impl", hName, "-o", cxxName, uiName });
      cmCustomCommandLines mocCommandLines =
        cmMakeSingleCommandLine({ moc_exe, "-o", mocName, hName });

      std::vector<std::string> depends;
      depends.push_back(uiName);
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(hName);
      cc->SetDepends(depends);
      cc->SetCommandLines(hCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));

      depends.push_back(hName);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(cxxName);
      cc->SetDepends(depends);
      cc->SetCommandLines(cxxCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));

      depends.clear();
      depends.push_back(hName);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(mocName);
      cc->SetDepends(depends);
      cc->SetCommandLines(mocCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));
    }
  }

  // Store the final list of source files and headers.
  mf.AddDefinition(sourceList, sourceListValue);
  mf.AddDefinition(headerList, headerListValue);
  return true;
}